

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::pp_get_lone_ident(CTcTokenizer *this,char *buf,size_t bufl)

{
  tc_toktyp_t tVar1;
  size_t sVar2;
  char *__src;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffbc;
  CTcTokenizer *in_stack_ffffffffffffffc0;
  void *__dest;
  undefined4 local_4;
  
  tVar1 = next_on_line((CTcTokenizer *)0x29b062);
  if (tVar1 == TOKT_SYM) {
    sVar2 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
    if (in_RDX < sVar2) {
      local_4 = 1;
    }
    else {
      __dest = in_RSI;
      __src = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
      sVar2 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      memcpy(__dest,__src,sVar2);
      sVar2 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      *(undefined1 *)((long)in_RSI + sVar2) = 0;
      tVar1 = next_on_line((CTcTokenizer *)0x29b11c);
      if (tVar1 == TOKT_EOF) {
        local_4 = 0;
      }
      else {
        log_error(0x2720);
        local_4 = 1;
      }
    }
  }
  else {
    log_error_curtok(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CTcTokenizer::pp_get_lone_ident(char *buf, size_t bufl)
{
    /* get the next token, and make sure it's a symbol */
    if (next_on_line() != TOKT_SYM)
    {
        log_error_curtok(TCERR_BAD_DEFINE_SYM);
        return 1;
    }

    /* return an error if it doesn't fit */
    if (curtok_.get_text_len() > bufl)
        return 1;

    /* copy the text */
    memcpy(buf, curtok_.get_text(), curtok_.get_text_len());
    buf[curtok_.get_text_len()] = '\0';

    /* make sure there's nothing else on the line but whitespace */
    if (next_on_line() != TOKT_EOF)
    {
        log_error(TCERR_PP_EXTRA);
        return 1;
    }

    /* success */
    return 0;
}